

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.h
# Opt level: O2

string * __thiscall
Component::mount_type_str_abi_cxx11_(string *__return_storage_ptr__,Component *this)

{
  int iVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  iVar1 = *(int *)&(this->super_BoardElement).field_0xc;
  if (iVar1 == 2) {
    __s = "DIP";
    __a = &local_a;
  }
  else if (iVar1 == 1) {
    __s = "SMD";
    __a = &local_9;
  }
  else {
    __s = "UNKNOWN";
    __a = &local_b;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string mount_type_str() {
		switch (mount_type) {
			case Component::kMountTypeSMD: return "SMD";
			case Component::kMountTypeDIP: return "DIP";
			default: return "UNKNOWN";
		}
	}